

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_Function_Test::ExprTest_Function_Test(ExprTest_Function_Test *this)

{
  ExprTest::ExprTest(&this->super_ExprTest);
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_0018f1c8;
  return;
}

Assistant:

TEST_F(ExprTest, Function) {
  mp::Function f;
  EXPECT_TRUE(f == 0);
  mp::Function foo = factory_.AddFunction("foo", 42, mp::func::SYMBOLIC);
  f = foo;
  EXPECT_STREQ("foo", f.name());
  EXPECT_EQ(42, f.num_args());
  EXPECT_EQ(mp::func::SYMBOLIC, f.type());
  mp::Function bar = factory_.AddFunction("bar", 0, mp::func::NUMERIC);
  f = bar;
  EXPECT_STREQ("bar", f.name());
  EXPECT_EQ(0, f.num_args());
  EXPECT_EQ(mp::func::NUMERIC, f.type());
  EXPECT_EQ(f, bar);
  EXPECT_NE(f, foo);
  EXPECT_EQ(foo, factory_.function(0));
  EXPECT_EQ(bar, factory_.function(1));
  EXPECT_ASSERT(factory_.function(-1), "invalid index");
  EXPECT_ASSERT(factory_.function(2), "invalid index");
}